

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camellia.c
# Opt level: O2

int mbedtls_camellia_crypt_ecb(mbedtls_camellia_context *ctx,int mode,uchar *input,uchar *output)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint32_t *k;
  uint local_48;
  uint local_44;
  undefined8 local_40;
  
  uVar3 = *(uint *)input;
  uVar1 = *(uint *)(input + 4);
  uVar2 = *(uint *)(input + 8);
  local_48 = (uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18) ^
             ctx->rk[0];
  uVar3 = *(uint *)(input + 0xc);
  local_44 = (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18) ^
             ctx->rk[1];
  k = ctx->rk + 4;
  local_40 = CONCAT44((uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                      uVar3 << 0x18) ^ ctx->rk[3],
                      (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                      uVar2 << 0x18) ^ ctx->rk[2]);
  iVar4 = ctx->nr;
  while (iVar4 != 0) {
    camellia_feistel(&local_48,k,(uint32_t *)&local_40);
    camellia_feistel((uint32_t *)&local_40,k + 2,&local_48);
    camellia_feistel(&local_48,k + 4,(uint32_t *)&local_40);
    camellia_feistel((uint32_t *)&local_40,k + 6,&local_48);
    camellia_feistel(&local_48,k + 8,(uint32_t *)&local_40);
    camellia_feistel((uint32_t *)&local_40,k + 10,&local_48);
    if (iVar4 == 1) {
      k = k + 0xc;
      iVar4 = iVar4 + -1;
    }
    else {
      local_44 = ((k[0xc] & local_48) << 1 | (uint)((int)(k[0xc] & local_48) < 0)) ^ local_44;
      local_48 = (local_44 | k[0xd]) ^ local_48;
      local_40._0_4_ = (k[0xf] | local_40._4_4_) ^ (uint)local_40;
      uVar3 = (uint)local_40 & k[0xe];
      local_40 = CONCAT44((uVar3 << 1 | (uint)((int)uVar3 < 0)) ^ local_40._4_4_,(uint)local_40);
      k = k + 0x10;
      iVar4 = iVar4 + -1;
    }
  }
  local_40 = local_40 ^ *(ulong *)k;
  local_48 = local_48 ^ k[2];
  local_44 = local_44 ^ k[3];
  *output = (uchar)(local_40 >> 0x18);
  output[1] = (uchar)(local_40 >> 0x10);
  output[2] = (uchar)(local_40 >> 8);
  output[3] = (uchar)local_40;
  output[4] = (uchar)(local_40 >> 0x38);
  output[5] = (uchar)(local_40 >> 0x30);
  output[6] = (uchar)(local_40 >> 0x28);
  output[7] = (uchar)(local_40 >> 0x20);
  output[8] = (uchar)(local_48 >> 0x18);
  output[9] = (uchar)(local_48 >> 0x10);
  output[10] = (uchar)(local_48 >> 8);
  output[0xb] = (uchar)local_48;
  output[0xc] = (uchar)(local_44 >> 0x18);
  output[0xd] = (uchar)(local_44 >> 0x10);
  output[0xe] = (uchar)(local_44 >> 8);
  output[0xf] = (uchar)local_44;
  return 0;
}

Assistant:

int mbedtls_camellia_crypt_ecb( mbedtls_camellia_context *ctx,
                    int mode,
                    const unsigned char input[16],
                    unsigned char output[16] )
{
    int NR;
    uint32_t *RK, X[4];
    CAMELLIA_VALIDATE_RET( ctx != NULL );
    CAMELLIA_VALIDATE_RET( mode == MBEDTLS_CAMELLIA_ENCRYPT ||
                           mode == MBEDTLS_CAMELLIA_DECRYPT );
    CAMELLIA_VALIDATE_RET( input  != NULL );
    CAMELLIA_VALIDATE_RET( output != NULL );

    ( (void) mode );

    NR = ctx->nr;
    RK = ctx->rk;

    GET_UINT32_BE( X[0], input,  0 );
    GET_UINT32_BE( X[1], input,  4 );
    GET_UINT32_BE( X[2], input,  8 );
    GET_UINT32_BE( X[3], input, 12 );

    X[0] ^= *RK++;
    X[1] ^= *RK++;
    X[2] ^= *RK++;
    X[3] ^= *RK++;

    while( NR ) {
        --NR;
        camellia_feistel( X, RK, X + 2 );
        RK += 2;
        camellia_feistel( X + 2, RK, X );
        RK += 2;
        camellia_feistel( X, RK, X + 2 );
        RK += 2;
        camellia_feistel( X + 2, RK, X );
        RK += 2;
        camellia_feistel( X, RK, X + 2 );
        RK += 2;
        camellia_feistel( X + 2, RK, X );
        RK += 2;

        if( NR ) {
            FL(X[0], X[1], RK[0], RK[1]);
            RK += 2;
            FLInv(X[2], X[3], RK[0], RK[1]);
            RK += 2;
        }
    }

    X[2] ^= *RK++;
    X[3] ^= *RK++;
    X[0] ^= *RK++;
    X[1] ^= *RK++;

    PUT_UINT32_BE( X[2], output,  0 );
    PUT_UINT32_BE( X[3], output,  4 );
    PUT_UINT32_BE( X[0], output,  8 );
    PUT_UINT32_BE( X[1], output, 12 );

    return( 0 );
}